

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  void *__s;
  size_t sz;
  ImSpanAllocator<3> span_allocator;
  
  span_allocator.BasePtr = (char *)0x0;
  span_allocator.TotalSize = 0;
  span_allocator.CurrSpan = 0;
  span_allocator.Offsets[0] = 0;
  span_allocator.Offsets[1] = 0;
  span_allocator.Offsets[2] = 0;
  span_allocator._28_4_ = 0;
  sz = (size_t)columns_count;
  ImSpanAllocator<3>::ReserveBytes(&span_allocator,0,sz * 0x68);
  ImSpanAllocator<3>::ReserveBytes(&span_allocator,1,sz);
  ImSpanAllocator<3>::ReserveBytes(&span_allocator,2,sz << 3);
  __s = MemAlloc((long)span_allocator.TotalSize);
  table->RawData = __s;
  memset(__s,0,(long)span_allocator.TotalSize);
  span_allocator.BasePtr = (char *)table->RawData;
  ImSpanAllocator<3>::GetSpan<ImGuiTableColumn>(&span_allocator,0,&table->Columns);
  ImSpanAllocator<3>::GetSpan<signed_char>(&span_allocator,1,&table->DisplayOrderToIndex);
  ImSpanAllocator<3>::GetSpan<ImGuiTableCellData>(&span_allocator,2,&table->RowCellData);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.ReserveBytes(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}